

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

bool __thiscall ON_CheckSum::Read(ON_CheckSum *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  
  this->m_crc[4] = 0;
  this->m_crc[5] = 0;
  this->m_crc[6] = 0;
  this->m_crc[7] = 0;
  this->m_crc[0] = 0;
  this->m_crc[1] = 0;
  this->m_crc[2] = 0;
  this->m_crc[3] = 0;
  this->m_size = 0;
  this->m_time = 0;
  bVar1 = ON_BinaryArchive::ReadBigSize(archive,&this->m_size);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::ReadBigTime(archive,&this->m_time);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadInt(archive,8,this->m_crc);
  }
  uVar2 = ON_BinaryArchive::ArchiveOpenNURBSVersion(archive);
  if ((0xbf4f5db < uVar2) && (iVar3 = ON_BinaryArchive::Archive3dmVersion(archive), 3 < iVar3)) {
    return bVar1;
  }
  this->m_crc[4] = 0;
  this->m_crc[5] = 0;
  this->m_crc[6] = 0;
  this->m_crc[7] = 0;
  this->m_crc[0] = 0;
  this->m_crc[1] = 0;
  this->m_crc[2] = 0;
  this->m_crc[3] = 0;
  this->m_size = 0;
  this->m_time = 0;
  return bVar1;
}

Assistant:

bool ON_CheckSum::Read(ON_BinaryArchive& archive)
{
  bool rc;

  Zero();

  rc  = archive.ReadBigSize(&m_size);
  if (rc)
    rc = archive.ReadBigTime(&m_time);
  if (rc)
    rc = archive.ReadInt(8,&m_crc[0]);

  if (    archive.ArchiveOpenNURBSVersion() < 200603100 
       || archive.Archive3dmVersion() < 4 
       )
  {
    // ON_CheckSums in V3 archives and V4 archives with
    // version < 200603100 have the same size but an 
    // incompatible format.  These were not used.
    Zero();
  }

  return rc;
}